

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetInfToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  string_view s;
  
  s.size_ = 3;
  s.data_ = "inf";
  bVar1 = MatchString(this,s);
  if (bVar1) {
    bVar1 = NoTrailingReservedChars(this);
    if (bVar1) {
      LiteralToken(__return_storage_ptr__,this,First_Literal,Infinity);
    }
    else {
      GetReservedToken(__return_storage_ptr__,this);
    }
  }
  else {
    GetKeywordToken(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetInfToken() {
  if (MatchString("inf")) {
    if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Infinity);
    }
    return GetReservedToken();
  }
  return GetKeywordToken();
}